

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

void sptk::snack::xrwindow(float *din,float *dout,int n,float preemp)

{
  long lVar1;
  
  if ((preemp != 0.0) || (NAN(preemp))) {
    lVar1 = 0;
    for (; 0 < n; n = n + -1) {
      *(float *)((long)dout + lVar1) =
           *(float *)((long)din + lVar1) * -preemp + *(float *)((long)din + lVar1 + 4);
      lVar1 = lVar1 + 4;
    }
  }
  else {
    lVar1 = 0;
    for (; 0 < n; n = n + -1) {
      *(undefined4 *)((long)dout + lVar1) = *(undefined4 *)((long)din + lVar1);
      lVar1 = lVar1 + 4;
    }
  }
  return;
}

Assistant:

void xrwindow(float *din, float *dout, int n, float preemp)
#endif
{
  register float *p;
 
/* If preemphasis is to be performed,  this assumes that there are n+1 valid
   samples in the input buffer (din). */
  if(preemp != 0.0) {
    for( p=din+1; n-- > 0; )
      *dout++ = (float)((*p++) - (preemp * *din++));
  } else {
    for( ; n-- > 0; )
      *dout++ =  *din++;
  }
}